

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  long *plVar2;
  int *__args;
  int iStack_18;
  int local_14;
  
  __args = &iStack_18;
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    std::vector<int,_std::allocator<int>_>::push_back
              (output,&FileDescriptorProto::kEnumTypeFieldNumber);
    plVar2 = (long *)(*(long *)(this + 0x10) + 0x60);
    if (*(long *)(this + 0x18) != 0) {
      plVar2 = (long *)(*(long *)(this + 0x18) + 0x50);
    }
    iVar1 = (int)(((long)this - *plVar2) / 0x38);
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
    std::vector<int,_std::allocator<int>_>::push_back(output,&DescriptorProto::kEnumTypeFieldNumber)
    ;
    plVar2 = (long *)(*(long *)(this + 0x10) + 0x60);
    if (*(long *)(this + 0x18) != 0) {
      plVar2 = (long *)(*(long *)(this + 0x18) + 0x50);
    }
    iVar1 = (int)(((long)this - *plVar2) / 0x38);
    __args = &local_14;
  }
  *__args = iVar1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,__args);
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}